

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void fuzz_deserializer(void)

{
  ulong __size;
  size_t j;
  char *data;
  ulong uVar1;
  uint uVar2;
  size_t i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 10000; lVar3 = lVar3 + 1) {
    uVar2 = seed * 0x41c64e6d + 0x3039;
    __size = (ulong)(uVar2 & 0x3fffffff) % 10000;
    seed = uVar2;
    data = (char *)malloc(__size);
    for (uVar1 = 0; __size != uVar1; uVar1 = uVar1 + 1) {
      uVar2 = uVar2 * 0x41c64e6d + 0x3039;
      seed = uVar2;
      data[uVar1] = (char)uVar2;
    }
    deserialization_test(data,__size);
    free(data);
  }
  return;
}

Assistant:

DEFINE_TEST(fuzz_deserializer) {
    for (size_t i = 0; i < 10000; i++) {
        size_t vec_size = our_rand() % 10000;
        char *buffer = malloc(vec_size);
        for (size_t j = 0; j < vec_size; j++) {
            buffer[j] = our_rand() % 256;
        }
        deserialization_test(buffer, vec_size);
        free(buffer);
    }
}